

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

void __thiscall
Diligent::ThreadPoolImpl::EnqueueTask
          (ThreadPoolImpl *this,IAsyncTask *pTask,IAsyncTask **ppPrerequisites,
          Uint32 NumPrerequisites)

{
  float fVar1;
  undefined4 in_register_0000000c;
  ulong __n;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  string msg;
  unique_lock<std::mutex> lock;
  float local_6c;
  undefined1 local_68 [8];
  undefined1 auStack_60 [28];
  float local_44;
  unique_lock<std::mutex> local_40;
  
  if (pTask == (IAsyncTask *)0x0) {
    FormatString<char[26],char[17]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pTask != nullptr",
               (char (*) [17])CONCAT44(in_register_0000000c,NumPrerequisites));
    DebugAssertionFailed
              ((Char *)local_68,"EnqueueTask",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
               ,0xb3);
    if (local_68 != (undefined1  [8])(auStack_60 + 8)) {
      operator_delete((void *)local_68,auStack_60._8_8_ + 1);
    }
  }
  else {
    local_40._M_device = &this->m_TasksQueueMtx;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    if (((this->m_Stop)._M_base._M_i & 1U) != 0) {
      FormatString<char[32]>((string *)local_68,(char (*) [32])"Enqueue on a stopped ThreadPool");
      DebugAssertionFailed
                ((Char *)local_68,"EnqueueTask",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                 ,0xb9);
      if (local_68 != (undefined1  [8])(auStack_60 + 8)) {
        operator_delete((void *)local_68,auStack_60._8_8_ + 1);
      }
    }
    auStack_60._8_8_ = 0;
    auStack_60._16_8_ = 0;
    local_68 = (undefined1  [8])0x0;
    auStack_60._0_8_ = (pointer)0x0;
    RefCntAutoPtr<Diligent::IAsyncTask>::operator=
              ((RefCntAutoPtr<Diligent::IAsyncTask> *)local_68,pTask);
    if (NumPrerequisites != 0 && ppPrerequisites != (IAsyncTask **)0x0) {
      __n = (ulong)NumPrerequisites;
      std::
      vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
      ::reserve((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                 *)auStack_60,__n);
      local_6c = 3.4028235e+38;
      do {
        fVar1 = local_6c;
        if (*ppPrerequisites != (IAsyncTask *)0x0) {
          std::
          vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>>>
          ::emplace_back<Diligent::IAsyncTask*&>
                    ((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>>>
                      *)auStack_60,ppPrerequisites);
          (*((*ppPrerequisites)->super_IObject)._vptr_IObject[9])();
          fVar1 = extraout_XMM0_Da;
          if (local_6c <= extraout_XMM0_Da) {
            fVar1 = local_6c;
          }
        }
        local_6c = fVar1;
        ppPrerequisites = ppPrerequisites + 1;
        __n = __n - 1;
      } while (__n != 0);
      (*(pTask->super_IObject)._vptr_IObject[9])(pTask);
      if (local_6c < extraout_XMM0_Da_00) {
        (**(code **)(*(long *)local_68 + 0x40))(local_6c);
      }
    }
    (*(pTask->super_IObject)._vptr_IObject[9])(pTask);
    std::
    _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
    ::_M_emplace_equal<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>
              ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                *)&this->m_TasksQueue,&local_44,(QueuedTaskInfo *)local_68);
    std::
    vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
    ::~vector((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
               *)auStack_60);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 0x10))();
      local_68 = (undefined1  [8])0x0;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

EnqueueTask(IAsyncTask*  pTask,
                                                IAsyncTask** ppPrerequisites,
                                                Uint32       NumPrerequisites) override final
    {
        VERIFY_EXPR(pTask != nullptr);
        if (pTask == nullptr)
            return;

        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            DEV_CHECK_ERR(!m_Stop, "Enqueue on a stopped ThreadPool");

            QueuedTaskInfo TaskInfo;
            TaskInfo.pTask = pTask;
            if (ppPrerequisites != nullptr && NumPrerequisites > 0)
            {
                TaskInfo.Prerequisites.reserve(NumPrerequisites);
                float MinPrereqPriority = +FLT_MAX;
                for (Uint32 i = 0; i < NumPrerequisites; ++i)
                {
                    if (ppPrerequisites[i] != nullptr)
                    {
                        TaskInfo.Prerequisites.emplace_back(ppPrerequisites[i]);
                        MinPrereqPriority = std::min(MinPrereqPriority, ppPrerequisites[i]->GetPriority());
                    }
                }
                if (pTask->GetPriority() > MinPrereqPriority)
                {
                    TaskInfo.pTask->SetPriority(MinPrereqPriority);
                }
            }

            m_TasksQueue.emplace(pTask->GetPriority(), std::move(TaskInfo));
        }
        m_NextTaskCond.notify_one();
    }